

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  cmCTest *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar1;
  int iVar2;
  mapped_type *ppcVar3;
  pointer puVar4;
  pointer puVar5;
  reference __x;
  ostream *poVar6;
  char *pcVar7;
  mapped_type_conflict1 *pmVar8;
  size_t sVar9;
  cmCTestRunTest *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  cmWorkingDirectory workdir;
  _Self local_238;
  key_type *local_230;
  string *f;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmCTestRunTest *testRun;
  ostringstream local_1e8 [8];
  ostringstream cmCTestLog_msg;
  _Rb_tree_const_iterator<unsigned_long> local_60;
  iterator p;
  size_t i;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> affinity;
  size_t needProcessors;
  cmCTestMultiProcessHandler *pcStack_18;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  needProcessors._4_4_ = test;
  pcStack_18 = this;
  if ((this->HaveAffinity != 0) &&
     (ppcVar3 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)((long)&needProcessors + 4)),
     ((*ppcVar3)->WantAffinity & 1U) != 0)) {
    puVar4 = (pointer)GetProcessorsUsed(this,needProcessors._4_4_);
    affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4;
    puVar5 = (pointer)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      size(&this->ProcessorsAvailable);
    if (puVar5 < puVar4) {
      this_local._7_1_ = 0;
      goto LAB_0023859c;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
               (size_type)
               affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    for (p._M_node = (_Base_ptr)0x0;
        p._M_node <
        affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
        p._M_node = (_Base_ptr)((long)&(p._M_node)->_M_color + 1)) {
      local_60._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (&this->ProcessorsAvailable);
      __x = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_60);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,__x);
      std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
      erase_abi_cxx11_((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
                       &this->ProcessorsAvailable,(const_iterator)local_60._M_node);
    }
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(*ppcVar3)->Affinity,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  }
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  poVar6 = std::operator<<((ostream *)local_1e8,"test ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,needProcessors._4_4_);
  std::operator<<(poVar6,"\n");
  this_00 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x9c,pcVar7,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string((string *)&testRun);
  std::__cxx11::ostringstream::~ostringstream(local_1e8);
  pmVar8 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,(key_type *)((long)&needProcessors + 4));
  *pmVar8 = true;
  EraseTest(this,needProcessors._4_4_);
  sVar9 = GetProcessorsUsed(this,needProcessors._4_4_);
  this->RunningCount = this->RunningCount + sVar9;
  this_02 = (cmCTestRunTest *)operator_new(0x228);
  cmCTestRunTest::cmCTestRunTest(this_02,this);
  bVar1 = cmCTest::GetRepeatUntilFail(this->CTest);
  if (bVar1) {
    cmCTestRunTest::SetRunUntilFailOn(this_02);
    iVar2 = cmCTest::GetTestRepeat(this->CTest);
    cmCTestRunTest::SetNumberOfRuns(this_02,iVar2);
  }
  cmCTestRunTest::SetIndex(this_02,needProcessors._4_4_);
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)((long)&needProcessors + 4));
  cmCTestRunTest::SetTestProperties(this_02,*ppcVar3);
  this_01 = this->Failed;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_01);
  f = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&f), bVar1) {
    local_230 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    local_238._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&(*ppcVar3)->RequireSuccessDepends,local_230);
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    workdir._32_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&(*ppcVar3)->RequireSuccessDepends);
    bVar1 = std::operator!=(&local_238,(_Self *)&workdir.ResultCode);
    if (bVar1) {
      cmCTestRunTest::AddFailedDependency(this_02,local_230);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  LockResources(this,needProcessors._4_4_);
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)((long)&needProcessors + 4));
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_268,&(*ppcVar3)->Directory);
  bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_268);
  if (bVar1) {
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)((long)&needProcessors + 4));
    std::operator+(&local_2c8,"Failed to change working directory to ",&(*ppcVar3)->Directory);
    std::operator+(&local_2a8,&local_2c8," : ");
    iVar2 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_268);
    pcVar7 = strerror(iVar2);
    std::operator+(&local_288,&local_2a8,pcVar7);
    cmCTestRunTest::StartFailure(this_02,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
LAB_0023855b:
    FinishTestProcess(this,this_02,false);
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = cmCTestRunTest::StartTest(this_02,this->Completed,this->Total);
    if (!bVar1) goto LAB_0023855b;
    this_local._7_1_ = 1;
  }
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_268);
LAB_0023859c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += GetProcessorsUsed(test);

  cmCTestRunTest* testRun = new cmCTestRunTest(*this);
  if (this->CTest->GetRepeatUntilFail()) {
    testRun->SetRunUntilFailOn();
    testRun->SetNumberOfRuns(this->CTest->GetTestRepeat());
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (this->Properties[test]->RequireSuccessDepends.find(f) !=
        this->Properties[test]->RequireSuccessDepends.end()) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    testRun->StartFailure("Failed to change working directory to " +
                          this->Properties[test]->Directory + " : " +
                          std::strerror(workdir.GetLastResult()));
  } else {
    if (testRun->StartTest(this->Completed, this->Total)) {
      return true;
    }
  }

  this->FinishTestProcess(testRun, false);
  return false;
}